

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.cpp
# Opt level: O0

float PhPacker::__phpack__detail::php_pack_parse_float(int is_little_endian,char *src)

{
  undefined4 local_1c;
  float f;
  char out [4];
  char *src_local;
  int is_little_endian_local;
  
  _f = (float *)src;
  memset(&local_1c,0,4);
  if (is_little_endian == 0) {
    local_1c = (float)CONCAT13(*(char *)_f,
                               CONCAT12(*(char *)((long)_f + 1),
                                        CONCAT11(*(char *)((long)_f + 2),*(char *)((long)_f + 3))));
  }
  else {
    local_1c = *_f;
  }
  return local_1c;
}

Assistant:

float php_pack_parse_float(int is_little_endian, const char* src) noexcept
{
    char out[4] = {};
    if (!is_little_endian) {
        out[0] = src[3];
        out[1] = src[2];
        out[2] = src[1];
        out[3] = src[0];
    } else {
        out[0] = src[0];
        out[1] = src[1];
        out[2] = src[2];
        out[3] = src[3];
    }
    float f {};
    memcpy(&f, out, sizeof(float));
    return f;
}